

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Scanner::visitExpression(wasm::Expression__
          (void *this,Expression *curr)

{
  bool bVar1;
  reference pTVar2;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *this_00;
  Type local_58;
  Type type;
  iterator __end3;
  iterator __begin3;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_38;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *local_20;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range3;
  Expression *curr_local;
  Scanner *this_local;
  
  __range3 = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)curr;
  curr_local = (Expression *)this;
  bVar1 = canBeArbitrarilyReplaced(*(TranslateToFuzzReader **)((long)this + 0xd8),curr);
  if (bVar1) {
    getRelevantTypes(wasm::Type_
              (&local_38,this,
               (Type)(__range3->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl
                     .super__Vector_impl_data._M_finish);
    local_20 = &local_38;
    __end3 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(local_20);
    type.id = (uintptr_t)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(local_20);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                       *)&type), bVar1) {
      pTVar2 = __gnu_cxx::
               __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
               ::operator*(&__end3);
      local_58.id = pTVar2->id;
      this_00 = InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                ::operator[]((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                              *)((long)this + 0xe0),&local_58);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (this_00,(value_type *)&__range3);
      __gnu_cxx::
      __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
      operator++(&__end3);
    }
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_38);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      if (parent.canBeArbitrarilyReplaced(curr)) {
        for (auto type : getRelevantTypes(curr->type)) {
          exprsByType[type].push_back(curr);
        }
      }
    }